

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O3

void __thiscall
cmCursesLongMessageForm::cmCursesLongMessageForm
          (cmCursesLongMessageForm *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *messages,char *title)

{
  char *pcVar1;
  pointer pbVar2;
  
  cmCursesForm::cmCursesForm(&this->super_cmCursesForm);
  (this->super_cmCursesForm)._vptr_cmCursesForm =
       (_func_int **)&PTR__cmCursesLongMessageForm_005c2c28;
  (this->Messages)._M_dataplus._M_p = (pointer)&(this->Messages).field_2;
  pcVar1 = (char *)0x0;
  (this->Messages)._M_string_length = 0;
  (this->Messages).field_2._M_local_buf[0] = '\0';
  (this->Title)._M_dataplus._M_p = (pointer)&(this->Title).field_2;
  (this->Title)._M_string_length = 0;
  (this->Title).field_2._M_local_buf[0] = '\0';
  pbVar2 = (messages->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar2 != (messages->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__cxx11::string::_M_append((char *)&this->Messages,(ulong)(pbVar2->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&this->Messages);
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != (messages->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    pcVar1 = (char *)(this->Title)._M_string_length;
  }
  strlen(title);
  std::__cxx11::string::_M_replace((ulong)&this->Title,0,pcVar1,(ulong)title);
  this->Fields[0] = (FIELD *)0x0;
  this->Fields[1] = (FIELD *)0x0;
  return;
}

Assistant:

cmCursesLongMessageForm::cmCursesLongMessageForm(std::vector<std::string>
                                                 const& messages, const char*
                                                 title)
{
  // Append all messages into on big string
  std::vector<std::string>::const_iterator it;
  for(it=messages.begin(); it != messages.end(); it++)
    {
    this->Messages += (*it);
    // Add one blank line after each message
    this->Messages += "\n\n";
    }
  this->Title = title;
  this->Fields[0] = 0;
  this->Fields[1] = 0;
}